

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O3

uchar _computeNumberBoolOperation<unsigned_char>(TokenType type,NumberToken *lhs,NumberToken *rhs)

{
  byte bVar1;
  byte bVar2;
  undefined6 in_register_0000003a;
  string local_30;
  
  bVar1 = (byte)rhs;
  bVar2 = (byte)lhs;
  switch((int)CONCAT62(in_register_0000003a,type)) {
  case 0x46:
    return bVar2 == bVar1;
  case 0x47:
    return bVar2 != bVar1;
  case 0x48:
    return bVar2 < bVar1;
  case 0x49:
    return bVar2 <= bVar1;
  case 0x4a:
    return bVar1 < bVar2;
  case 0x4b:
    return bVar1 <= bVar2;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown operation","");
  pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                 ,0xb3,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return '\0';
}

Assistant:

static R _computeNumberBoolOperation(TokenType type, const NumberToken &lhs, const NumberToken &rhs) {
	switch (type) {
	case TokenType::TOK_OP_LT:
		return lhs.getNumber<R>() < rhs.getNumber<R>();
	case TokenType::TOK_OP_GT:
		return lhs.getNumber<R>() > rhs.getNumber<R>();
	case TokenType::TOK_OP_LEQ:
		return lhs.getNumber<R>() <= rhs.getNumber<R>();
	case TokenType::TOK_OP_GEQ:
		return lhs.getNumber<R>() >= rhs.getNumber<R>();
	case TokenType::TOK_OP_EQ:
		return lhs.getNumber<R>() == rhs.getNumber<R>();
	case TokenType::TOK_OP_NQ:
		return lhs.getNumber<R>() != rhs.getNumber<R>();
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}